

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_sharing.cpp
# Opt level: O0

void benchmarkSharing<FarApart>(void)

{
  FarApart *local_b0;
  thread local_a8;
  thread t2;
  thread local_98;
  thread t1;
  FarApart t;
  
  t1._M_id._M_thread._0_4_ = 1;
  t2._M_id._M_thread = (id)(id)&t1;
  std::thread::thread<void(&)(FarApart*),FarApart*,void>(&local_98,readA<FarApart>,(FarApart **)&t2)
  ;
  local_b0 = (FarApart *)&t1;
  std::thread::thread<void(&)(FarApart*),FarApart*,void>(&local_a8,writeB<FarApart>,&local_b0);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_a8);
  std::thread::~thread(&local_98);
  return;
}

Assistant:

void benchmarkSharing() {
  T t;
  t.a = 1;
  t.b = 1;
  std::thread t1(readA<T>, &t);
  std::thread t2(writeB<T>, &t);
  t1.join();
  t2.join();
}